

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disflow_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_186ea36::ComputeFlowTest::RunCheckOutput(ComputeFlowTest *this,int run_times)

{
  ACMRandom *this_00;
  ComputeFlowTest *pCVar1;
  byte bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  aom_image_t *paVar5;
  int64_t iVar6;
  int iVar7;
  int x;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  SEARCH_METHODS *pSVar8;
  int y;
  bool bVar9;
  AssertionResult gtest_ar_2;
  AssertHelper local_120;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_118;
  uint8_t *ref;
  uint8_t *src;
  aom_usec_timer ref_timer;
  double v_test;
  double u_test;
  aom_usec_timer test_timer;
  double v_ref;
  double u_ref;
  double local_a0;
  ComputeFlowTest *local_98;
  YUVVideoSource video;
  
  std::__cxx11::string::string
            ((string *)&ref_timer,"bus_352x288_420_f20_b8.yuv",(allocator *)&test_timer);
  libaom_test::YUVVideoSource::YUVVideoSource
            (&video,(string *)&ref_timer,AOM_IMG_FMT_I420,0x160,0x120,0x1e,1,0,2);
  std::__cxx11::string::~string((string *)&ref_timer);
  libaom_test::YUVVideoSource::Begin(&video);
  paVar5 = video.img_;
  if (video.limit_ <= video.frame_) {
    paVar5 = (aom_image_t *)0x0;
  }
  src = paVar5->planes[0];
  test_timer.begin.tv_sec = 0;
  testing::internal::CmpHelperNE<unsigned_char*,decltype(nullptr)>
            ((internal *)&ref_timer,"src","nullptr",&src,(void **)&test_timer);
  if ((char)ref_timer.begin.tv_sec == '\0') {
    testing::Message::Message((Message *)&test_timer);
    if (ref_timer.begin.tv_usec == 0) {
      pSVar8 = "";
    }
    else {
      pSVar8 = *(SEARCH_METHODS **)ref_timer.begin.tv_usec;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/disflow_test.cc"
               ,0x35,(char *)pSVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&test_timer);
    this_01 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&ref_timer.begin.tv_usec;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    if (test_timer.begin.tv_sec != 0) {
      (**(code **)(*(long *)test_timer.begin.tv_sec + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&ref_timer.begin.tv_usec);
    video.frame_ = video.frame_ + 1;
    (*video.super_VideoSource._vptr_VideoSource[0xb])();
    if (video.limit_ <= video.frame_) {
      video.img_ = (aom_image_t *)0x0;
    }
    ref = (video.img_)->planes[0];
    test_timer.begin.tv_sec = 0;
    testing::internal::CmpHelperNE<unsigned_char*,decltype(nullptr)>
              ((internal *)&ref_timer,"ref","nullptr",&ref,(void **)&test_timer);
    if ((char)ref_timer.begin.tv_sec == '\0') {
      testing::Message::Message((Message *)&test_timer);
      if (ref_timer.begin.tv_usec == 0) {
        pSVar8 = "";
      }
      else {
        pSVar8 = *(SEARCH_METHODS **)ref_timer.begin.tv_usec;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/disflow_test.cc"
                 ,0x38,(char *)pSVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&test_timer)
      ;
      this_01 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&ref_timer.begin.tv_usec;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
      if (test_timer.begin.tv_sec != 0) {
        (**(code **)(*(long *)test_timer.begin.tv_sec + 8))();
      }
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&ref_timer.begin.tv_usec);
      this_00 = &this->rnd_;
      bVar2 = libaom_test::ACMRandom::Rand8(this_00);
      u_test = ((double)bVar2 / 255.0) * 10.0 + -5.0;
      u_ref = u_test;
      bVar2 = libaom_test::ACMRandom::Rand8(this_00);
      v_test = ((double)bVar2 / 255.0) * 10.0 + -5.0;
      v_ref = v_test;
      uVar3 = testing::internal::Random::Generate(&this_00->random_,0x151);
      uVar4 = testing::internal::Random::Generate(&this_00->random_,0x111);
      x = uVar3 + 8;
      y = uVar4 + 8;
      aom_compute_flow_at_point_c(src,ref,x,y,0x160,0x120,0x160,&u_ref,&v_ref);
      (*this->target_func_)(src,ref,x,y,0x160,0x120,0x160,&u_test,&v_test);
      if (1 < run_times) {
        local_98 = this;
        ::aom_usec_timer_start(&ref_timer);
        iVar7 = run_times;
        while (bVar9 = iVar7 != 0, iVar7 = iVar7 + -1, bVar9) {
          aom_compute_flow_at_point_c(src,ref,x,y,0x160,0x120,0x160,&u_ref,&v_ref);
        }
        ::aom_usec_timer_mark(&ref_timer);
        iVar6 = ::aom_usec_timer_elapsed(&ref_timer);
        local_a0 = (double)iVar6;
        ::aom_usec_timer_start(&test_timer);
        pCVar1 = local_98;
        while (bVar9 = run_times != 0, run_times = run_times + -1, bVar9) {
          (*pCVar1->target_func_)(src,ref,x,y,0x160,0x120,0x160,&u_test,&v_test);
        }
        ::aom_usec_timer_mark(&test_timer);
        iVar6 = ::aom_usec_timer_elapsed(&test_timer);
        printf("c_time=%fns \t simd_time=%fns \t speedup=%.2f\n",local_a0,(double)iVar6,
               local_a0 / (double)iVar6);
        goto LAB_00679e22;
      }
      testing::internal::CmpHelperEQ<double,double>
                ((internal *)&gtest_ar_2,"u_ref","u_test",&u_ref,&u_test);
      if (gtest_ar_2.success_ == false) {
        testing::Message::Message((Message *)&local_118);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_2.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pSVar8 = "";
        }
        else {
          pSVar8 = *(SEARCH_METHODS **)
                    gtest_ar_2.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_120,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/disflow_test.cc"
                   ,0x67,(char *)pSVar8);
        testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_118);
        this_01 = &gtest_ar_2.message_;
        testing::internal::AssertHelper::~AssertHelper(&local_120);
        if (local_118._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_118._M_head_impl + 8))();
        }
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_2.message_);
        testing::internal::CmpHelperEQ<double,double>
                  ((internal *)&gtest_ar_2,"v_ref","v_test",&v_ref,&v_test);
        if (gtest_ar_2.success_ == false) {
          testing::Message::Message((Message *)&local_118);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_2.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pSVar8 = "";
          }
          else {
            pSVar8 = *(SEARCH_METHODS **)
                      gtest_ar_2.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_120,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/disflow_test.cc"
                     ,0x68,(char *)pSVar8);
          testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_118);
          this_01 = &gtest_ar_2.message_;
          testing::internal::AssertHelper::~AssertHelper(&local_120);
          if (local_118._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_118._M_head_impl + 8))();
          }
        }
        else {
          this_01 = &gtest_ar_2.message_;
        }
      }
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(this_01);
LAB_00679e22:
  libaom_test::YUVVideoSource::~YUVVideoSource(&video);
  return;
}

Assistant:

void ComputeFlowTest::RunCheckOutput(int run_times) {
  constexpr int kWidth = 352;
  constexpr int kHeight = 288;

  ::libaom_test::YUVVideoSource video("bus_352x288_420_f20_b8.yuv",
                                      AOM_IMG_FMT_I420, kWidth, kHeight, 30, 1,
                                      0, 2);
  // Use Y (Luminance) plane.
  video.Begin();
  uint8_t *src = video.img()->planes[0];
  ASSERT_NE(src, nullptr);
  video.Next();
  uint8_t *ref = video.img()->planes[0];
  ASSERT_NE(ref, nullptr);

  // Pick a random value between -5 and 5. The range was chosen arbitrarily as
  // u and v can take any kind of value in practise, but it shouldn't change the
  // outcome of the tests.
  const double u_rand = (static_cast<double>(rnd_.Rand8()) / 255) * 10 - 5;
  double u_ref = u_rand;
  double u_test = u_rand;

  const double v_rand = (static_cast<double>(rnd_.Rand8()) / 255) * 10 - 5;
  double v_ref = v_rand;
  double v_test = v_rand;

  // Pick a random point in the frame. If the frame is 352x288, that means we
  // can call the function on all values of x comprised between 8 and 344, and
  // all values of y comprised between 8 and 280.
  const int x = rnd_((kWidth - 8) - 8 + 1) + 8;
  const int y = rnd_((kHeight - 8) - 8 + 1) + 8;

  aom_usec_timer ref_timer, test_timer;

  aom_compute_flow_at_point_c(src, ref, x, y, kWidth, kHeight, kWidth, &u_ref,
                              &v_ref);

  target_func_(src, ref, x, y, kWidth, kHeight, kWidth, &u_test, &v_test);

  if (run_times > 1) {
    aom_usec_timer_start(&ref_timer);
    for (int i = 0; i < run_times; ++i) {
      aom_compute_flow_at_point_c(src, ref, x, y, kWidth, kHeight, kWidth,
                                  &u_ref, &v_ref);
    }
    aom_usec_timer_mark(&ref_timer);
    const double elapsed_time_c =
        static_cast<double>(aom_usec_timer_elapsed(&ref_timer));

    aom_usec_timer_start(&test_timer);
    for (int i = 0; i < run_times; ++i) {
      target_func_(src, ref, x, y, kWidth, kHeight, kWidth, &u_test, &v_test);
    }
    aom_usec_timer_mark(&test_timer);
    const double elapsed_time_simd =
        static_cast<double>(aom_usec_timer_elapsed(&test_timer));

    printf("c_time=%fns \t simd_time=%fns \t speedup=%.2f\n", elapsed_time_c,
           elapsed_time_simd, (elapsed_time_c / elapsed_time_simd));
  } else {
    ASSERT_EQ(u_ref, u_test);
    ASSERT_EQ(v_ref, v_test);
  }
}